

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilderCmd.cpp
# Opt level: O3

int cmdline_parser_required2(gengetopt_args_info *args_info,char *prog_name,char *additional_error)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *__format;
  bool bVar5;
  
  bVar5 = args_info->output_given == 0;
  if (bVar5) {
    fprintf(_stderr,"%s: \'--output\' (\'-o\') option required%s\n",prog_name,"");
  }
  uVar4 = (uint)bVar5;
  if (args_info->density_given == 0) {
    fprintf(_stderr,"%s: \'--density\' option required%s\n",prog_name,"");
    uVar4 = 1;
  }
  if (args_info->nx_given == 0) {
    fprintf(_stderr,"%s: \'--nx\' option required%s\n",prog_name,"");
    uVar4 = 1;
  }
  if (args_info->ny_given == 0) {
    fprintf(_stderr,"%s: \'--ny\' option required%s\n",prog_name,"");
    uVar4 = 1;
  }
  if (args_info->nz_given == 0) {
    fprintf(_stderr,"%s: \'--nz\' option required%s\n",prog_name,"");
    uVar4 = 1;
  }
  uVar1 = args_info->molFraction_given;
  if (uVar1 != 0) {
    uVar2 = args_info->molFraction_min;
    uVar3 = args_info->molFraction_max;
    if (uVar3 == 0 && uVar2 == 0) {
      return uVar4;
    }
    if (uVar2 == 0 || uVar3 == 0) {
      if (uVar2 == 0) {
        if (uVar1 <= uVar3 || uVar3 == 0) {
          return uVar4;
        }
        __format = "%s: %s option occurrences must be at most %d\n";
        uVar2 = uVar3;
      }
      else {
        if (uVar2 <= uVar1) {
          return uVar4;
        }
        __format = "%s: %s option occurrences must be at least %d\n";
      }
    }
    else {
      if (uVar2 != uVar3) {
        if ((uVar2 <= uVar1) && (uVar1 <= uVar3)) {
          return uVar4;
        }
        fprintf(_stderr,"%s: %s option occurrences must be between %d and %d\n",prog_name,
                "\'--molFraction\'");
        return 1;
      }
      if (uVar1 == uVar2) {
        return uVar4;
      }
      __format = "%s: %s option occurrences must be %d\n";
    }
    fprintf(_stderr,__format,prog_name,"\'--molFraction\'",(ulong)uVar2);
    return 1;
  }
  return uVar4;
}

Assistant:

int
cmdline_parser_required2 (struct gengetopt_args_info *args_info, const char *prog_name, const char *additional_error)
{
  int error_occurred = 0;
  FIX_UNUSED (additional_error);

  /* checks for required options */
  if (! args_info->output_given)
    {
      fprintf (stderr, "%s: '--output' ('-o') option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->density_given)
    {
      fprintf (stderr, "%s: '--density' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->nx_given)
    {
      fprintf (stderr, "%s: '--nx' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->ny_given)
    {
      fprintf (stderr, "%s: '--ny' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->nz_given)
    {
      fprintf (stderr, "%s: '--nz' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (check_multiple_option_occurrences(prog_name, args_info->molFraction_given, args_info->molFraction_min, args_info->molFraction_max, "'--molFraction'"))
     error_occurred = 1;
  
  
  /* checks for dependences among options */

  return error_occurred;
}